

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int http_client_close(http_server_t *server,http_client_t *client)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  if (client->fd == -1) {
    iVar2 = 0;
  }
  else {
    iVar2 = close(client->fd);
  }
  client->fd = -1;
  client->found = 0;
  client->in = 0;
  client->len = 0;
  uVar1 = server->num_clients;
  uVar3 = server->count_clients - 1;
  server->count_clients = uVar3;
  if (2 < uVar1 && uVar3 <= uVar1 >> 2) {
    iVar4 = http_server_realloc(server,uVar1 >> 1);
    if (iVar4 == 0) {
      http_client_close_cold_1();
    }
  }
  http_server_assert(server);
  return iVar2;
}

Assistant:

int http_client_close(http_server_t *server,
                      http_client_t *client) {
  int retval = 0;
  
  if (client->fd != -1) {
    retval = close(client->fd);
  }
  
  http_client_init(client);
  server->count_clients--;
  
  /* trim down memory size */
  if ((server->count_clients <= (server->num_clients / 4)) &&
      (server->num_clients > HTTP_MIN_CLIENTS)) {
    if (!http_server_realloc(server, server->num_clients / 2)) {
      /* not really critical */
      fprintf(stderr,
              "Could not cut down the size of the server structure\n");
    }
  }

  http_server_assert(server);
  
  return retval;
}